

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::OnAtomicWait
          (SharedValidator *this,Location *loc,Opcode opcode,Address alignment)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  MemoryType mt;
  Opcode local_cc;
  Limits local_c8;
  Info local_b0;
  Var local_78;
  
  local_c8.initial = 0;
  local_c8.max._0_7_ = 0;
  local_c8._15_4_ = 0;
  this->expr_loc_ = loc;
  local_cc.enum_ = opcode.enum_;
  Var::Var(&local_78,0,loc);
  RVar1 = CheckMemoryIndex(this,&local_78,(MemoryType *)&local_c8);
  Var::~Var(&local_78);
  Opcode::GetInfo(&local_b0,&local_cc);
  RVar2 = CheckAtomicAlign(this,loc,alignment,local_b0.memory_size);
  RVar3 = TypeChecker::OnAtomicWait(&this->typechecker_,local_cc,&local_c8);
  RVar1.enum_._0_1_ = RVar3.enum_ == Error || (RVar2.enum_ == Error || RVar1.enum_ == Error);
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnAtomicWait(const Location& loc,
                                     Opcode opcode,
                                     Address alignment) {
  Result result = Result::Ok;
  MemoryType mt;
  expr_loc_ = &loc;
  result |= CheckMemoryIndex(Var(0, loc), &mt);
  result |= CheckAtomicAlign(loc, alignment, opcode.GetMemorySize());
  result |= typechecker_.OnAtomicWait(opcode, mt.limits);
  return result;
}